

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend_sdl.cpp
# Opt level: O2

bool __thiscall
CCommandProcessorFragment_SDL::RunCommand
          (CCommandProcessorFragment_SDL *this,CCommand *pBaseCommand)

{
  uint uVar1;
  
  uVar1 = pBaseCommand->m_Cmd;
  if (uVar1 == 0x4e21) {
    SDL_GL_MakeCurrent(0,0);
  }
  else if (uVar1 == 9) {
    Cmd_VSync(this,(CVSyncCommand *)pBaseCommand);
  }
  else if (uVar1 == 20000) {
    Cmd_Init(this,(CInitCommand *)pBaseCommand);
  }
  else {
    if (uVar1 != 8) {
      return false;
    }
    Cmd_Swap(this,(CSwapCommand *)pBaseCommand);
  }
  return true;
}

Assistant:

bool CCommandProcessorFragment_SDL::RunCommand(const CCommandBuffer::CCommand *pBaseCommand)
{
	switch(pBaseCommand->m_Cmd)
	{
	case CCommandBuffer::CMD_SWAP: Cmd_Swap(static_cast<const CCommandBuffer::CSwapCommand *>(pBaseCommand)); break;
	case CCommandBuffer::CMD_VSYNC: Cmd_VSync(static_cast<const CCommandBuffer::CVSyncCommand *>(pBaseCommand)); break;
	case CMD_INIT: Cmd_Init(static_cast<const CInitCommand *>(pBaseCommand)); break;
	case CMD_SHUTDOWN: Cmd_Shutdown(static_cast<const CShutdownCommand *>(pBaseCommand)); break;
	default: return false;
	}

	return true;
}